

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall
cmGeneratorTarget::GetFileSuffixInternal
          (cmGeneratorTarget *this,ArtifactType artifact,string *language)

{
  cmMakefile *pcVar1;
  undefined8 uVar2;
  TargetType TVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  cmGeneratorTarget *local_1a0;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string langSuffix;
  char *suffixVar;
  string local_b8;
  byte local_93;
  byte local_92;
  allocator<char> local_91;
  string local_90;
  cmGeneratorTarget *local_70;
  char *targetSuffix;
  byte local_52;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  string *psStack_28;
  bool isImportedLibraryArtifact;
  string *language_local;
  cmGeneratorTarget *pcStack_18;
  ArtifactType artifact_local;
  cmGeneratorTarget *this_local;
  
  psStack_28 = language;
  language_local._4_4_ = artifact;
  pcStack_18 = this;
  TVar3 = GetType(this);
  if ((((TVar3 == STATIC_LIBRARY) || (TVar3 = GetType(this), TVar3 == SHARED_LIBRARY)) ||
      (TVar3 = GetType(this), TVar3 == MODULE_LIBRARY)) ||
     (TVar3 = GetType(this), TVar3 == EXECUTABLE)) {
    local_29 = language_local._4_4_ == ImportLibraryArtifact;
    local_52 = 0;
    targetSuffix._3_1_ = 0;
    bVar6 = false;
    if ((bool)local_29) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_52 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_51);
      targetSuffix._3_1_ = 1;
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_50);
      bVar6 = pcVar4 == (char *)0x0;
    }
    if ((targetSuffix._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    if ((local_52 & 1) != 0) {
      std::allocator<char>::~allocator(&local_51);
    }
    if (bVar6) {
      this_local = (cmGeneratorTarget *)0x0;
    }
    else {
      TVar3 = GetType(this);
      if (((TVar3 != SHARED_LIBRARY) && (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) &&
         (TVar3 = GetType(this), TVar3 != EXECUTABLE)) {
        language_local._4_4_ = RuntimeBinaryArtifact;
      }
      local_92 = 0;
      local_93 = 0;
      suffixVar._6_1_ = 0;
      suffixVar._5_1_ = 0;
      if ((local_29 & 1) == 0) {
        std::allocator<char>::allocator();
        suffixVar._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"SUFFIX",(allocator<char> *)((long)&suffixVar + 7));
        suffixVar._5_1_ = 1;
        local_1a0 = (cmGeneratorTarget *)GetProperty(this,&local_b8);
      }
      else {
        std::allocator<char>::allocator();
        local_92 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"IMPORT_SUFFIX",&local_91);
        local_93 = 1;
        local_1a0 = (cmGeneratorTarget *)GetProperty(this,&local_90);
      }
      if ((suffixVar._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_b8);
      }
      if ((suffixVar._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&suffixVar + 7));
      }
      if ((local_93 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      if ((local_92 & 1) != 0) {
        std::allocator<char>::~allocator(&local_91);
      }
      local_70 = local_1a0;
      if (local_1a0 == (cmGeneratorTarget *)0x0) {
        langSuffix.field_2._8_8_ =
             cmTarget::GetSuffixVariableInternal(this->Target,language_local._4_4_);
        uVar5 = std::__cxx11::string::empty();
        uVar2 = langSuffix.field_2._8_8_;
        if ((((uVar5 & 1) == 0) && (langSuffix.field_2._8_8_ != 0)) &&
           (*(char *)langSuffix.field_2._8_8_ != '\0')) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"_",&local_129);
          std::operator+(&local_108,(char *)uVar2,&local_128);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,&local_108,psStack_28);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator(&local_129);
          local_70 = (cmGeneratorTarget *)
                     cmMakefile::GetDefinition(this->Makefile,(string *)local_e8);
          std::__cxx11::string::~string((string *)local_e8);
        }
        uVar2 = langSuffix.field_2._8_8_;
        if ((local_70 == (cmGeneratorTarget *)0x0) && (langSuffix.field_2._8_8_ != 0)) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,(char *)uVar2,&local_151);
          local_70 = (cmGeneratorTarget *)cmMakefile::GetDefinition(pcVar1,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator(&local_151);
        }
      }
      this_local = local_70;
    }
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetFileSuffixInternal(
  cmStateEnums::ArtifactType artifact, const std::string& language) const
{
  // no suffix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty suffix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute suffix value.
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));

  if (!targetSuffix) {
    const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);
    if (!language.empty() && suffixVar && *suffixVar) {
      std::string langSuffix = suffixVar + std::string("_") + language;
      targetSuffix = this->Makefile->GetDefinition(langSuffix);
    }

    // if there is no suffix on the target nor specific language
    // use the cmake definition.
    if (!targetSuffix && suffixVar) {
      targetSuffix = this->Makefile->GetDefinition(suffixVar);
    }
  }

  return targetSuffix;
}